

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall
HEkk::updateDualSteepestEdgeWeights
          (HEkk *this,HighsInt row_out,HighsInt variable_in,HVector *column,
          double new_pivotal_edge_weight,double Kai,double *dual_steepest_edge_array)

{
  HVectorBase<double> *pHVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  size_type sVar5;
  reference pvVar6;
  double *pdVar7;
  long in_RCX;
  long in_RDI;
  long in_R8;
  double in_XMM0_Qa;
  double dVar8;
  double in_XMM1_Qa;
  double basic_col_scale;
  double dual_steepest_edge_array_value;
  double aa_iRow;
  HighsInt iRow;
  HighsInt iEntry;
  bool convert_to_scaled_space;
  bool use_row_indices;
  HighsInt to_entry;
  HVector alt_pivotal_column;
  HVector alt_dual_steepest_edge_column;
  bool DSE_check;
  double inv_col_ap_scale;
  double col_ap_scale;
  double col_aq_scale;
  double *column_array;
  HighsInt *variable_index;
  HighsInt column_count;
  HighsInt num_row;
  HVectorBase<double> *in_stack_fffffffffffffdc0;
  HSimplexNla *in_stack_fffffffffffffdc8;
  HighsSimplexAnalysis *in_stack_fffffffffffffdd0;
  int local_214;
  double local_1f8;
  HVectorBase<double> *local_1f0;
  int local_1e0;
  int local_1d8 [93];
  undefined1 local_61;
  double local_60;
  double local_58;
  double local_50;
  double *local_48;
  int *local_40;
  HighsInt local_38;
  uint local_34;
  long local_30;
  double local_28;
  double local_20;
  long local_18;
  
  local_30 = in_R8;
  local_28 = in_XMM1_Qa;
  local_20 = in_XMM0_Qa;
  local_18 = in_RCX;
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_fffffffffffffdd0,(HighsInt)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
             (HighsInt)in_stack_fffffffffffffdc8);
  local_34 = *(uint *)(in_RDI + 0x219c);
  local_38 = *(HighsInt *)(local_18 + 4);
  local_40 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x771bd1);
  local_48 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x771bea);
  local_50 = HSimplexNla::variableScaleFactor
                       (in_stack_fffffffffffffdc8,
                        (HighsInt)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
  local_58 = HSimplexNla::basicColScaleFactor
                       (in_stack_fffffffffffffdc8,
                        (HighsInt)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
  local_60 = 1.0 / local_58;
  local_61 = 0;
  HVectorBase<double>::HVectorBase(in_stack_fffffffffffffdc0);
  HVectorBase<double>::HVectorBase(in_stack_fffffffffffffdc0);
  sVar5 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a20));
  local_1f0 = in_stack_fffffffffffffdc0;
  if ((int)sVar5 < (int)local_34) {
    uVar3 = *(uint *)(in_RDI + 0x3860);
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a20));
    printf("HEkk::updateDualSteepestEdgeWeights solve %d: dual_edge_weight_.size() = %d < %d\n",
           (ulong)uVar3,sVar5 & 0xffffffff,(ulong)local_34);
    fflush(_stdout);
    local_1f0 = in_stack_fffffffffffffdc0;
  }
  bVar4 = HSimplexNla::sparseLoopStyle((HSimplexNla *)(in_RDI + 0x2b38),local_38,local_34,local_1d8)
  ;
  bVar2 = *(byte *)(in_RDI + 0x2a50);
  for (local_1e0 = 0; local_1e0 < local_1d8[0]; local_1e0 = local_1e0 + 1) {
    if (bVar4) {
      local_214 = local_40[local_1e0];
    }
    else {
      local_214 = local_1e0;
    }
    pHVar1 = (HVectorBase<double> *)local_48[local_214];
    if (((double)pHVar1 != 0.0) || (NAN((double)pHVar1))) {
      local_1f8 = *(double *)(local_30 + (long)local_214 * 8);
      if (((bVar2 ^ 0xff) & 1) != 0) {
        dVar8 = HSimplexNla::basicColScaleFactor
                          (in_stack_fffffffffffffdc8,(HighsInt)((ulong)local_1f0 >> 0x20));
        local_1f8 = local_60 * local_1f8;
        pHVar1 = (HVectorBase<double> *)(local_50 * ((double)pHVar1 / dVar8));
      }
      local_1f0 = pHVar1;
      in_stack_fffffffffffffdc8 =
           (HSimplexNla *)(local_20 * (double)local_1f0 + local_28 * local_1f8);
      in_stack_fffffffffffffdd0 = (HighsSimplexAnalysis *)(in_RDI + 0x2a20);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0,
                          (long)local_214);
      *pvVar6 = (double)local_1f0 * (double)in_stack_fffffffffffffdc8 + *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0,
                          (long)local_214);
      pdVar7 = std::max<double>(&kMinDualSteepestEdgeWeight,pvVar6);
      dVar8 = *pdVar7;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a20),
                          (long)local_214);
      *pvVar6 = dVar8;
    }
  }
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_fffffffffffffdd0,(HighsInt)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
             (HighsInt)in_stack_fffffffffffffdc8);
  HVectorBase<double>::~HVectorBase(local_1f0);
  HVectorBase<double>::~HVectorBase(local_1f0);
  return;
}

Assistant:

void HEkk::updateDualSteepestEdgeWeights(
    const HighsInt row_out, const HighsInt variable_in, const HVector* column,
    const double new_pivotal_edge_weight, const double Kai,
    const double* dual_steepest_edge_array) {
  analysis_.simplexTimerStart(DseUpdateWeightClock);

  const HighsInt num_row = lp_.num_row_;
  const HighsInt column_count = column->count;
  const HighsInt* variable_index = column->index.data();
  const double* column_array = column->array.data();

  const double col_aq_scale = simplex_nla_.variableScaleFactor(variable_in);
  const double col_ap_scale = simplex_nla_.basicColScaleFactor(row_out);
  const double inv_col_ap_scale = 1.0 / col_ap_scale;

  const bool DSE_check = false;
  HVector alt_dual_steepest_edge_column;
  HVector alt_pivotal_column;
  if (DSE_check) {
    // Compute the DSE column otherwise to check
    alt_dual_steepest_edge_column.setup(num_row);
    alt_dual_steepest_edge_column.clear();
    alt_dual_steepest_edge_column.count = 1;
    alt_dual_steepest_edge_column.index[0] = row_out;
    alt_dual_steepest_edge_column.array[row_out] = 1;
    alt_dual_steepest_edge_column.packFlag = false;
    simplex_nla_.btranInScaledSpace(alt_dual_steepest_edge_column,
                                    info_.row_ep_density,
                                    analysis_.pointer_serial_factor_clocks);
    simplex_nla_.ftranInScaledSpace(alt_dual_steepest_edge_column,
                                    info_.row_DSE_density,
                                    analysis_.pointer_serial_factor_clocks);
    // Compute the pivotal column in the scaled space otherwise to check
    //
    // Need \bar{B}^{-1}(R.aq.cq) = \bar{B}^{-1}R.(cq.aq)
    //
    alt_pivotal_column.setup(num_row);
    alt_pivotal_column.clear();
    //
    // Determine cq, and apply it in forming RHS
    //
    lp_.a_matrix_.collectAj(alt_pivotal_column, variable_in, col_aq_scale);
    simplex_nla_.applyBasisMatrixRowScale(alt_pivotal_column);
    simplex_nla_.ftranInScaledSpace(alt_pivotal_column, info_.col_aq_density,
                                    analysis_.pointer_serial_factor_clocks);
    double max_dse_column_error = 0;
    double sum_dse_column_error = 0;
    HighsInt num_dse_column_error = 0;
    const double dse_column_value_tolerance = 1e-2;
    const double dse_column_error_tolerance = 1e-4;
    HighsInt DSE_array_count = 0;
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      const double dual_steepest_edge_array_value =
          dual_steepest_edge_array[iRow] * inv_col_ap_scale;
      if (dual_steepest_edge_array_value) DSE_array_count++;
      if (std::abs(dual_steepest_edge_array_value) >
              dse_column_value_tolerance ||
          std::abs(alt_dual_steepest_edge_column.array[iRow]) >
              dse_column_value_tolerance) {
        const double dse_column_error =
            std::abs(alt_dual_steepest_edge_column.array[iRow] -
                     dual_steepest_edge_array_value) /
            std::max(1.0, std::abs(dual_steepest_edge_array_value));
        sum_dse_column_error += dse_column_error;
        if (dse_column_error > dse_column_error_tolerance) {
          max_dse_column_error =
              std::max(dse_column_error, max_dse_column_error);
          num_dse_column_error++;
        }
      }
    }
    if (max_dse_column_error > dse_column_error_tolerance) {
      printf(
          "HEkk::updateDualSteepestEdgeWeights: Iter %2d has num / max / sum = "
          "%d / %g / %g DSE column errors exceeding = %g\n",
          (int)iteration_count_, (int)num_dse_column_error,
          max_dse_column_error, sum_dse_column_error,
          dse_column_error_tolerance);
      printf("DSE column count alt = %d; og = %d)\n",
             (int)alt_dual_steepest_edge_column.count, (int)DSE_array_count);
      for (HighsInt iRow = 0; iRow < num_row; iRow++) {
        const double dual_steepest_edge_array_value =
            dual_steepest_edge_array[iRow] * inv_col_ap_scale;
        if (alt_dual_steepest_edge_column.array[iRow] != 0 &&
            dual_steepest_edge_array_value != 0) {
          const double dse_column_error =
              std::abs(alt_dual_steepest_edge_column.array[iRow] -
                       dual_steepest_edge_array_value) /
              std::max(1.0, std::abs(dual_steepest_edge_array_value));
          if (dse_column_error > 1e-10)
            printf(
                "Row %4d: DSE column (alt = %11.4g; og = %11.4g) difference "
                "%10.4g\n",
                (int)iRow, alt_dual_steepest_edge_column.array[iRow],
                dual_steepest_edge_array_value, dse_column_error);
        }
      }
      fflush(stdout);
      assert(max_dse_column_error < dse_column_error_tolerance);
    }
  }

  if ((HighsInt)dual_edge_weight_.size() < num_row) {
    printf(
        "HEkk::updateDualSteepestEdgeWeights solve %d: "
        "dual_edge_weight_.size() = %d < %d\n",
        (int)debug_solve_call_num_, (int)dual_edge_weight_.size(),
        (int)num_row);
    fflush(stdout);
  }
  assert((HighsInt)dual_edge_weight_.size() >= num_row);
  HighsInt to_entry;
  const bool use_row_indices =
      simplex_nla_.sparseLoopStyle(column_count, num_row, to_entry);
  const bool convert_to_scaled_space = !simplex_in_scaled_space_;
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow = use_row_indices ? variable_index[iEntry] : iEntry;
    double aa_iRow = column_array[iRow];
    if (!aa_iRow) continue;
    double dual_steepest_edge_array_value = dual_steepest_edge_array[iRow];
    if (convert_to_scaled_space) {
      double basic_col_scale = simplex_nla_.basicColScaleFactor(iRow);
      aa_iRow /= basic_col_scale;
      aa_iRow *= col_aq_scale;
      dual_steepest_edge_array_value *= inv_col_ap_scale;
    }
    if (DSE_check) {
      const double pivotal_column_error =
          std::abs(aa_iRow - alt_pivotal_column.array[iRow]);
      if (pivotal_column_error > 1e-4) {
        printf(
            "HEkk::updateDualSteepestEdgeWeights Row %2d of pivotal column has "
            "error %10.4g\n",
            (int)iRow, pivotal_column_error);
        fflush(stdout);
      }
      assert(pivotal_column_error < 1e-4);
    }
    dual_edge_weight_[iRow] += aa_iRow * (new_pivotal_edge_weight * aa_iRow +
                                          Kai * dual_steepest_edge_array_value);
    dual_edge_weight_[iRow] =
        std::max(kMinDualSteepestEdgeWeight, dual_edge_weight_[iRow]);
  }
  analysis_.simplexTimerStop(DseUpdateWeightClock);
}